

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

void Col_RopeIterLast(ColRopeIterator *it,Col_Word rope)

{
  size_t sVar1;
  size_t sVar2;
  
  it->rope = rope;
  sVar1 = Col_RopeLength(rope);
  it->length = sVar1;
  sVar2 = 0;
  if (sVar1 != 0) {
    sVar2 = sVar1 - 1;
  }
  it->index = sVar2;
  (it->chunk).first = 0xffffffffffffffff;
  return;
}

Assistant:

void
Col_RopeIterLast(
    Col_RopeIterator it,    /*!< Iterator to initialize. */
    Col_Word rope)          /*!< Rope to iterate over. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) {
        Col_RopeIterSetNull(it);
        return;
    }

    it->rope = rope;
    it->length = Col_RopeLength(rope);
    if (it->length == 0) {
        /*
         * End of rope.
         */

        it->index = 0;
    } else {
        it->index = it->length-1;
    }

    /*
     * Traversal info will be lazily computed.
     */

    it->chunk.first = SIZE_MAX;
}